

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QThread::requestInterruption(QThread *this)

{
  qsizetype *this_00;
  long lVar1;
  void *copy;
  QObjectData *pQVar2;
  
  pQVar2 = (this->super_QObject).d_ptr.d;
  if ((AtomicType)pQVar2[2].q_ptr[5].d_ptr.d ==
      QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p) {
    requestInterruption();
    return;
  }
  this_00 = &pQVar2[1].children.d.size;
  if (pQVar2[1].children.d.size == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 == 0) goto LAB_00347a03;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_00347a03:
  if ((char)pQVar2[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
            .super___atomic_base<int>._M_i == '\x01') {
    *(undefined1 *)
     ((long)&pQVar2[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + 2) = 1;
  }
  LOCK();
  copy = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (copy == (void *)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }